

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine.cpp
# Opt level: O2

QFileSystemEntry *
QFileSystemEngine::getJunctionTarget
          (QFileSystemEntry *__return_storage_ptr__,QFileSystemEntry *link,QFileSystemMetaData *data
          )

{
  QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QFileSystemEntry QFileSystemEngine::getJunctionTarget(const QFileSystemEntry &link,
                                                      QFileSystemMetaData &data)
{
#if defined(Q_OS_WIN)
    return junctionTarget(link, data);
#else
    Q_UNUSED(link);
    Q_UNUSED(data);
    return {};
#endif
}